

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

string * el::base::utils::Str::toUpper(string *str)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  size_type sVar4;
  
  pcVar1 = (str->_M_dataplus)._M_p;
  sVar2 = str->_M_string_length;
  for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
    iVar3 = toupper((int)pcVar1[sVar4]);
    pcVar1[sVar4] = (char)iVar3;
  }
  return str;
}

Assistant:

std::string& Str::toUpper(std::string& str) {
  std::transform(str.begin(), str.end(), str.begin(),
  [](char c) {
    return static_cast<char>(::toupper(c));
  });
  return str;
}